

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_restricted_packet_assignment_no_alias<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,1>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>
               *src,assign_op<float,_float> *func)

{
  Index func_00;
  Matrix<float,__1,__1,_0,__1,__1> *dstExpr;
  undefined1 local_a8 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_68 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> *func_local;
  Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>
  *src_local;
  Matrix<float,__1,__1,_0,__1,__1> *dst_local;
  
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_innerDim = (Index)func;
  evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>_>
  ::evaluator((evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>
               *)local_68,src);
  resize_if_allowed<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,1>,float,float>
            (dst,src,(assign_op<float,_float> *)
                     srcEvaluator.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                     .m_innerDim);
  evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::evaluator
            ((evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
             &kernel.
              super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_1>
              .m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
            .m_innerDim;
  dstExpr = EigenBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)dst);
  restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>_>,_Eigen::internal::assign_op<float,_float>_>
  ::restricted_packet_dense_assignment_kernel
            ((restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<float,_float>_>
              *)local_a8,
             (evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
             &kernel.
              super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_1>
              .m_dstExpr,
             (evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>
              *)local_68,(assign_op<float,_float> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>_>,_Eigen::internal::assign_op<float,_float>_>,_0,_0>
  ::run((restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<float,_float>_>
         *)local_a8);
  evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~evaluator
            ((evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
             &kernel.
              super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_1>
              .m_dstExpr);
  evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>_>
  ::~evaluator((evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>
                *)local_68);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_restricted_packet_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
    typedef evaluator<Dst> DstEvaluatorType;
    typedef evaluator<Src> SrcEvaluatorType;
    typedef restricted_packet_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Func> Kernel;

    EIGEN_STATIC_ASSERT_LVALUE(Dst)
    EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename Dst::Scalar,typename Src::Scalar);

    SrcEvaluatorType srcEvaluator(src);
    resize_if_allowed(dst, src, func);

    DstEvaluatorType dstEvaluator(dst);
    Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

    dense_assignment_loop<Kernel>::run(kernel);
}